

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_text(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *this,char *begin,char *end)

{
  iterator it_00;
  buffer_appender<char> __result;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  buffer_appender<char> *it;
  iterator out;
  type size;
  size_t in_stack_ffffffffffffffb0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffb8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __first;
  
  to_unsigned<long>(in_RDX - in_RSI);
  it_00 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out
                    ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     (in_RDI + 0x20));
  __first = it_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  __result = reserve<char>((buffer_appender<char>)in_stack_ffffffffffffffb8.container,
                           in_stack_ffffffffffffffb0);
  std::copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>
            ((char *)__first.container,(unsigned_long)in_stack_ffffffffffffffb8.container,__result);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(in_RDI + 0x20),
             it_00);
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }